

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.h
# Opt level: O2

void __thiscall
MinVR::VRDataIndex::_setValueSpecialized(VRDataIndex *this,VRDatumPtr *p,VRFloatArray *value)

{
  VRDatumSpecialized<std::vector<float,_std::allocator<float>_>,_(MinVR::VRCORETYPE_ID)5> *this_00;
  _Vector_base<float,_std::allocator<float>_> local_30;
  
  this_00 = (VRDatumSpecialized<std::vector<float,_std::allocator<float>_>,_(MinVR::VRCORETYPE_ID)5>
             *)VRDatumPtr::floatArrayVal(p);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_30,value);
  VRDatumSpecialized<std::vector<float,_std::allocator<float>_>,_(MinVR::VRCORETYPE_ID)5>::setValue
            (this_00,(vector<float,_std::allocator<float>_> *)&local_30);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_30);
  return;
}

Assistant:

void _setValueSpecialized(VRDatumPtr p, VRFloatArray value) {
    p.floatArrayVal()->setValue(value);
  }